

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  UINT16 UVar2;
  ushort uVar3;
  uint uVar4;
  byte bVar5;
  int resshift_00;
  int iVar6;
  INT32 outData;
  UINT32 sizemask;
  int resshift;
  UINT8 chnMask;
  uint uStack_54;
  INT16 vol;
  UINT16 freq;
  UINT16 wtsize;
  UINT32 acc;
  UINT32 altram;
  UINT32 wtptr;
  ES5503Osc *pOsc;
  UINT8 chan;
  ES5503Chip *pEStack_38;
  UINT8 chnsStereo;
  ES5503Chip *chip;
  uint local_28;
  UINT32 ramptr;
  UINT32 snum;
  UINT8 osc;
  DEV_SMPL **outputs_local;
  void *pvStack_10;
  UINT32 samples_local;
  void *param_local;
  
  pEStack_38 = (ES5503Chip *)param;
  _snum = outputs;
  outputs_local._4_4_ = samples;
  pvStack_10 = param;
  memset(*outputs,0,(ulong)samples << 2);
  memset(_snum[1],0,(ulong)outputs_local._4_4_ << 2);
  pOsc._7_1_ = pEStack_38->output_channels & 0xfe;
  ramptr._3_1_ = 0;
  do {
    if (pEStack_38->oscsenabled <= ramptr._3_1_) {
      return;
    }
    _altram = pEStack_38->oscillators + ramptr._3_1_;
    if (((_altram->control & 1) == 0) && (_altram->Muted == '\0')) {
      acc = _altram->wavetblpointer & wavemasks[_altram->wavetblsize];
      uStack_54 = _altram->accumulator;
      UVar2 = _altram->wtsize;
      uVar3 = _altram->freq;
      bVar1 = _altram->vol;
      resshift_00 = resshifts[_altram->resolution] - (uint)_altram->wavetblsize;
      uVar4 = accmasks[_altram->wavetblsize];
      bVar5 = (byte)((int)(uint)_altram->control >> 4) & pEStack_38->outchn_mask;
      for (local_28 = 0; local_28 < outputs_local._4_4_; local_28 = local_28 + 1) {
        _freq = uStack_54 >> ((byte)resshift_00 & 0x1f);
        chip._4_4_ = _freq & uVar4;
        uStack_54 = uVar3 + uStack_54;
        pEStack_38->channel_strobe = (UINT8)((int)(uint)_altram->control >> 4);
        _altram->data = pEStack_38->docram[chip._4_4_ + acc];
        if (_altram->data == '\0') {
          es5503_halt_osc(pEStack_38,(uint)ramptr._3_1_,1,&stack0xffffffffffffffac,resshift_00);
        }
        else {
          iVar6 = (_altram->data - 0x80) * (int)(short)(ushort)bVar1;
          for (pOsc._6_1_ = 0; pOsc._6_1_ < pOsc._7_1_; pOsc._6_1_ = pOsc._6_1_ + 1) {
            if (pOsc._6_1_ == bVar5) {
              _snum[(int)(pOsc._6_1_ & 1)][local_28] =
                   iVar6 + _snum[(int)(pOsc._6_1_ & 1)][local_28];
            }
          }
          iVar6 = iVar6 * 0xb5 >> 8;
          for (; pOsc._6_1_ < pEStack_38->output_channels; pOsc._6_1_ = pOsc._6_1_ + 1) {
            if (pOsc._6_1_ == bVar5) {
              (*_snum)[local_28] = iVar6 + (*_snum)[local_28];
              _snum[1][local_28] = iVar6 + _snum[1][local_28];
            }
          }
          if ((ushort)(UVar2 - 1) <= _freq) {
            es5503_halt_osc(pEStack_38,(uint)ramptr._3_1_,0,&stack0xffffffffffffffac,resshift_00);
          }
        }
        if ((_altram->control & 1) != 0) {
          _altram->control = _altram->control | 1;
          break;
        }
      }
      _altram->accumulator = uStack_54;
    }
    ramptr._3_1_ = ramptr._3_1_ + 1;
  } while( true );
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	chnsStereo = chip->output_channels & ~1;
	for (osc = 0; osc < chip->oscsenabled; osc++)
	{
		ES5503Osc *pOsc = &chip->oscillators[osc];

		if (!(pOsc->control & 1) && ! pOsc->Muted)
		{
			UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
			UINT32 altram;
			UINT32 acc = pOsc->accumulator;
			UINT16 wtsize = pOsc->wtsize - 1;
			UINT16 freq = pOsc->freq;
			INT16 vol = pOsc->vol;
			UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
			int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
			UINT32 sizemask = accmasks[pOsc->wavetblsize];
			INT32 outData;

			chnMask &= chip->outchn_mask;
			for (snum = 0; snum < samples; snum++)
			{
				altram = acc >> resshift;
				ramptr = altram & sizemask;

				acc += freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &acc, resshift);
				}
				else
				{
					outData = (pOsc->data - 0x80) * vol;
					
					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &acc, resshift);
					}
				}

				// if oscillator halted, we've got no more samples to generate
				if (pOsc->control & 1)
				{
					pOsc->control |= 1;
					break;
				}
			}

			pOsc->accumulator = acc;
		}
	}
}